

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjLookupTable::mark_refs(CVmObjLookupTable *this,uint state)

{
  int *piVar1;
  ulong uVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  
  puVar4 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  if (puVar4[4] == 5) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,puVar4[6],state);
  }
  uVar2 = (ulong)*puVar4;
  puVar4 = puVar4 + 8;
  while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, puVar3 = puVar4, bVar5) {
    while (piVar1 = *(int **)puVar3, piVar1 != (int *)0x0) {
      if (*piVar1 == 5) {
        CVmObjTable::add_to_gc_queue(&G_obj_table_X,piVar1[2],state);
      }
      if (piVar1[4] == 5) {
        CVmObjTable::add_to_gc_queue(&G_obj_table_X,piVar1[6],state);
      }
      puVar3 = (uint *)(piVar1 + 8);
    }
    puVar4 = puVar4 + 2;
  }
  return;
}

Assistant:

void CVmObjLookupTable::mark_refs(VMG_ uint state)
{
    /* get my extension */
    vm_lookup_ext *ext = get_ext();

    /* mark the default value */
    const vm_val_t *val = &ext->default_value;
    if (val->typ == VM_OBJ)
        G_obj_table->mark_all_refs(val->val.obj, state);

    /* run through my buckets */
    vm_lookup_val **bp = ext->buckets;
    size_t i = ext->bucket_cnt;
    for ( ; i != 0 ; ++bp, --i)
    {
        /* run through all entries attached to this bucket */
        for (const vm_lookup_val *entry = *bp ; entry != 0 ;
             entry = entry->nxt)
        {
            /* if the key is an object, mark it as referenced */
            val = &entry->key;
            if  (val->typ == VM_OBJ)
                G_obj_table->mark_all_refs(val->val.obj, state);

            /* if the entry is an object, mark it as referenced */
            val = &entry->val;
            if (val->typ == VM_OBJ)
                G_obj_table->mark_all_refs(val->val.obj, state);
        }
    }
}